

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  undefined1 uVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  bool bVar6;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    cVar4 = '\a';
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        cVar4 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      }
      else {
LAB_0015e775:
        cVar4 = '\x1d';
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    cVar4 = '\b';
  }
  else {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto LAB_0015e775;
    cVar4 = '\0';
  }
  iVar5 = 0x16;
  switch(cVar4) {
  case '\x05':
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    break;
  case '\x06':
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    break;
  case '\a':
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    break;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
    break;
  case '\t':
  case '\n':
  case '\x15':
    goto switchD_0015e79a_caseD_9;
  case '\x16':
  case '\x18':
switchD_0015e79a_caseD_16:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar3 = (long)end - (long)ptr;
    ptr = ptr + 4;
LAB_0015e830:
    lVar3 = lVar3 + -2;
    bVar1 = ptr[-2];
    if (bVar1 < 0xdc) {
      uVar2 = 7;
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          uVar2 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[-1]);
        }
        else {
LAB_0015e881:
          uVar2 = 0x1d;
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      uVar2 = 8;
    }
    else {
      if ((bVar1 != 0xff) || ((byte)ptr[-1] < 0xfe)) goto LAB_0015e881;
      uVar2 = 0;
    }
    switch(uVar2) {
    case 5:
      if (lVar3 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar3 < 3) {
        return -2;
      }
      break;
    case 7:
      if (lVar3 < 4) {
        return -2;
      }
      break;
    case 0x12:
      iVar5 = 0x1c;
      goto switchD_0015e79a_caseD_9;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0015e89d_caseD_16;
    case 0x1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)((byte)ptr[-1] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
           ((byte)ptr[-1] & 0x1f) & 1) != 0) goto switchD_0015e89d_caseD_16;
    }
    ptr = ptr + -2;
    break;
  default:
    if (cVar4 == '\x1e') goto switchD_0015e79a_caseD_9;
    if ((cVar4 == '\x1d') &&
       ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) != 0)) goto switchD_0015e79a_caseD_16;
  }
  iVar5 = 0;
switchD_0015e79a_caseD_9:
  *nextTokPtr = ptr;
  return iVar5;
switchD_0015e89d_caseD_16:
  bVar6 = ptr == end;
  ptr = ptr + 2;
  if (bVar6) {
    return -1;
  }
  goto LAB_0015e830;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}